

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer.cpp
# Opt level: O1

void __thiscall udpdiscovery::impl::PeerEnv::ReceivingThreadFunc(PeerEnv *this)

{
  MinimalisticMutex *__mutex;
  bool bVar1;
  ssize_t sVar2;
  AddressLenType addr_length;
  IpPort from;
  string buffer;
  timespec ts;
  sockaddr_in from_addr;
  socklen_t local_7c;
  IpPort local_78;
  string local_70;
  timespec local_50;
  sockaddr local_40;
  
  __mutex = &this->lock_;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  this->ref_count_ = this->ref_count_ + 1;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  do {
    local_7c = 0x10;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::resize((ulong)&local_70,'\0');
    sVar2 = recvfrom(this->binding_sock_,local_70._M_dataplus._M_p,local_70._M_string_length,0,
                     &local_40,&local_7c);
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    bVar1 = this->exit_;
    if (bVar1 == true) {
      decreaseRefCountAndMaybeDestroySelfAndUnlock(this);
    }
    else {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      if (0 < (int)sVar2) {
        local_78.port_ =
             (int)(ushort)(local_40.sa_data._0_2_ << 8 | (ushort)local_40.sa_data._0_2_ >> 8);
        local_78.ip_ = (uint)local_40.sa_data._2_4_ >> 0x18 |
                       (local_40.sa_data._2_4_ & 0xff0000) >> 8 |
                       (local_40.sa_data._2_4_ & 0xff00) << 8 | local_40.sa_data._2_4_ << 0x18;
        std::__cxx11::string::resize((ulong)&local_70,(char)sVar2);
        clock_gettime(1,&local_50);
        processReceivedBuffer
                  (this,local_50.tv_nsec / 1000000 + local_50.tv_sec * 1000,&local_78,&local_70);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  } while (bVar1 == false);
  return;
}

Assistant:

void ReceivingThreadFunc() {
    lock_.Lock();
    ++ref_count_;
    lock_.Unlock();

    while (true) {
      sockaddr_in from_addr;
      AddressLenType addr_length = sizeof(sockaddr_in);

      std::string buffer;
      buffer.resize(kMaxPacketSize);

      int length = (int)recvfrom(binding_sock_, &buffer[0], buffer.size(), 0,
                                 (struct sockaddr*)&from_addr, &addr_length);

      lock_.Lock();
      if (exit_) {
        decreaseRefCountAndMaybeDestroySelfAndUnlock();
        return;
      }
      lock_.Unlock();

      if (length <= 0) {
        continue;
      }

      IpPort from;
      from.set_port(ntohs(from_addr.sin_port));
      from.set_ip(ntohl(from_addr.sin_addr.s_addr));

      buffer.resize(length);
      processReceivedBuffer(NowTime(), from, buffer);
    }
  }